

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

void __thiscall tst_InsertProxyModel::testSourceInsertCol_data(tst_InsertProxyModel *this)

{
  long *plVar1;
  QTestData *pQVar2;
  bool *value;
  long lVar3;
  char *pcVar4;
  long lVar5;
  QArrayDataPointer<char> local_268;
  QArrayDataPointer<char> local_250;
  QArrayDataPointer<char> local_238;
  QArrayDataPointer<char> local_220;
  undefined4 *local_208;
  tst_InsertProxyModel *local_200;
  undefined8 *local_1f8;
  QArrayDataPointer<char> local_1f0;
  undefined1 local_1d8 [16];
  qsizetype local_1c8;
  undefined1 local_1b8;
  QByteArray local_1b0;
  long local_198;
  long *local_190;
  long local_188;
  long local_180;
  QFlags<InsertProxyModel::InsertDirection> *local_178;
  QByteArray *local_170;
  QByteArray *local_168;
  QArrayDataPointer<char> local_160;
  QArrayDataPointer<char> local_148;
  undefined1 local_130 [8];
  QByteArray local_128;
  undefined4 local_110 [2];
  QByteArray local_108;
  int local_f0;
  QByteArray local_e8;
  undefined1 local_d0 [16];
  qsizetype local_c0;
  code *local_b0;
  QByteArray local_a8;
  undefined1 local_90 [8];
  QByteArray local_88;
  undefined4 local_70;
  QByteArray local_68;
  undefined4 local_50;
  QByteArray local_48;
  
  local_200 = this;
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QFlags<InsertProxyModel::InsertDirection>>
            ("insertDirection",(QFlags<InsertProxyModel::InsertDirection> *)0x0);
  QTest::addColumnInternal(2,"indexToInsert");
  QTest::addColumnInternal(1,"addViaProxy");
  local_d0._0_8_ = (Data *)0x0;
  local_d0._8_8_ = "Extra Row";
  local_c0 = 9;
  local_130 = (undefined1  [8])0x0;
  local_128.d.d = (Data *)0x12169a;
  local_128.d.ptr = (char *)0x9;
  local_90._0_4_ = 1;
  QByteArray::QByteArray(&local_88,(QByteArray *)local_130);
  local_268.d = (Data *)0x0;
  local_268.ptr = "Extra Column";
  local_268.size = 0xc;
  local_1d8._0_8_ = (Data *)0x0;
  local_1d8._8_8_ = "Extra Column";
  local_1c8 = 0xc;
  local_70 = 2;
  QByteArray::QByteArray(&local_68,(QByteArray *)local_1d8);
  local_250.d = (Data *)0x0;
  local_250.ptr = "Extra Row and Column";
  local_250.size = 0x14;
  local_238.d = (Data *)0x0;
  local_238.ptr = "Extra Row and Column";
  local_238.size = 0x14;
  local_50 = 3;
  QByteArray::QByteArray(&local_48,(QByteArray *)&local_238);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_238);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_250);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1d8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_268);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_130);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_d0);
  local_208 = local_110;
  lVar3 = 0;
  while (lVar3 != 0x60) {
    local_1d8._0_8_ = (Data *)0x0;
    local_1d8._8_8_ = "Table";
    local_130 = (undefined1  [8])0x0;
    local_1c8 = 5;
    local_128.d.d = (Data *)0x120a4e;
    local_128.d.ptr = (char *)0x5;
    local_d0._0_8_ = createTableModel;
    local_198 = lVar3;
    QByteArray::QByteArray((QByteArray *)(local_d0 + 8),(QByteArray *)local_130);
    local_238.d = (Data *)0x0;
    local_238.ptr = "Tree";
    local_268.d = (Data *)0x0;
    local_238.size = 4;
    local_268.ptr = "Tree";
    local_268.size = 4;
    local_b0 = createTreeModel;
    QByteArray::QByteArray(&local_a8,(QByteArray *)&local_268);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_268);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_238);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_130);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1d8);
    local_170 = (QByteArray *)((long)&local_88.d.d + lVar3);
    lVar5 = 0;
    local_178 = (QFlags<InsertProxyModel::InsertDirection> *)(local_90 + lVar3);
    while( true ) {
      if (lVar5 == 0x40) break;
      local_1f8 = (undefined8 *)(local_d0 + lVar5);
      local_188 = lVar5;
      plVar1 = (long *)(*(code *)*local_1f8)(local_200);
      if (plVar1 != (long *)0x0) {
        local_268.d = (Data *)0x0;
        local_268.ptr = "Begin";
        local_268.size = 5;
        local_1d8._0_8_ = (Data *)0x0;
        local_1d8._8_8_ = "Begin";
        local_1c8 = 5;
        local_130 = (undefined1  [8])((ulong)local_130 & 0xffffffff00000000);
        QByteArray::QByteArray(&local_128,(QByteArray *)local_1d8);
        local_238.d = (Data *)0xffffffffffffffff;
        local_238.ptr = (char *)0x0;
        local_238.size = 0;
        local_110[0] = (**(code **)(*plVar1 + 0x80))(plVar1,&local_238);
        local_220.d = (Data *)0x0;
        local_220.ptr = "End";
        local_250.d = (Data *)0x0;
        local_220.size = 3;
        local_250.ptr = "End";
        local_250.size = 3;
        QByteArray::QByteArray(&local_108,(QByteArray *)&local_250);
        local_148.d = (Data *)0xffffffffffffffff;
        local_148.ptr = (char *)0x0;
        local_148.size = 0;
        local_190 = plVar1;
        local_f0 = (**(code **)(*plVar1 + 0x80))(plVar1,&local_148);
        local_f0 = local_f0 / 2;
        local_160.d = (Data *)0x0;
        local_160.ptr = "Middle";
        local_160.size = 6;
        local_1f0.d = (Data *)0x0;
        local_1f0.ptr = "Middle";
        local_1f0.size = 6;
        QByteArray::QByteArray(&local_e8,(QByteArray *)&local_1f0);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_1f0);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_160);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_250);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_220);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1d8);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_268);
        local_168 = (QByteArray *)(local_1f8 + 1);
        lVar3 = 0;
        while (lVar3 != 0x60) {
          local_238.d = (Data *)0x0;
          local_238.ptr = "via Proxy";
          local_268.d = (Data *)0x0;
          local_238.size = 9;
          local_268.ptr = "via Proxy";
          local_268.size = 9;
          local_1d8[0] = 1;
          local_180 = lVar3;
          QByteArray::QByteArray((QByteArray *)(local_1d8 + 8),(QByteArray *)&local_268);
          local_220.d = (Data *)0x0;
          local_220.ptr = "via Base";
          local_250.d = (Data *)0x0;
          local_220.size = 8;
          local_250.ptr = "via Base";
          local_250.size = 8;
          local_1b8 = 0;
          QByteArray::QByteArray(&local_1b0,(QByteArray *)&local_250);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_250);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_220);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_268);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_238);
          value = (bool *)local_1d8;
          for (lVar5 = 0x40; lVar5 != 0; lVar5 = lVar5 + -0x20) {
            operator+((QByteArray *)&local_1f0,local_168,' ');
            operator+((QByteArray *)&local_148,(QByteArray *)&local_1f0,local_170);
            operator+((QByteArray *)&local_220,(QByteArray *)&local_148,' ');
            operator+((QByteArray *)&local_250,(QByteArray *)&local_220,(QByteArray *)(value + 8));
            operator+((QByteArray *)&local_238,(QByteArray *)&local_250,' ');
            operator+((QByteArray *)&local_268,(QByteArray *)&local_238,
                      (QByteArray *)((long)&local_128.d.d + lVar3));
            pcVar4 = local_268.ptr;
            if (local_268.ptr == (char *)0x0) {
              pcVar4 = (char *)&QByteArray::_empty;
            }
            pQVar2 = (QTestData *)QTest::newRow(pcVar4);
            local_160.d = (Data *)(*(code *)*local_1f8)(local_200);
            pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_160);
            pQVar2 = operator<<(pQVar2,local_178);
            pQVar2 = operator<<(pQVar2,(int *)(local_130 + lVar3));
            operator<<(pQVar2,value);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_268);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_238);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_250);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_220);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_148);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_1f0);
            value = value + 0x20;
          }
          lVar3 = 0x28;
          do {
            QArrayDataPointer<char>::~QArrayDataPointer
                      ((QArrayDataPointer<char> *)(local_1d8 + lVar3));
            lVar3 = lVar3 + -0x20;
          } while (lVar3 != -0x18);
          lVar3 = local_180 + 0x20;
        }
        lVar3 = 0x48;
        do {
          QArrayDataPointer<char>::~QArrayDataPointer
                    ((QArrayDataPointer<char> *)(local_130 + lVar3));
          lVar3 = lVar3 + -0x20;
        } while (lVar3 != -0x18);
        QObject::deleteLater();
      }
      lVar5 = local_188 + 0x20;
    }
    lVar3 = 0x28;
    do {
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_d0 + lVar3));
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x18);
    lVar3 = local_198 + 0x20;
  }
  lVar3 = 0x48;
  do {
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_90 + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void tst_InsertProxyModel::testSourceInsertCol_data()
{

    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<InsertProxyModel::InsertDirections>("insertDirection");
    QTest::addColumn<int>("indexToInsert");
    QTest::addColumn<bool>("addViaProxy");

    for (auto &&insertDirection :
         {std::make_pair<InsertProxyModel::InsertDirections, QByteArray>(InsertProxyModel::InsertRow, QByteArrayLiteral("Extra Row")),
          std::make_pair<InsertProxyModel::InsertDirections, QByteArray>(InsertProxyModel::InsertColumn, QByteArrayLiteral("Extra Column")),
          std::make_pair<InsertProxyModel::InsertDirections, QByteArray>(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow,
                                                                         QByteArrayLiteral("Extra Row and Column"))}) {

        for (auto &&baseModel :
             {std::make_pair(&createTableModel, QByteArrayLiteral("Table")), std::make_pair(&createTreeModel, QByteArrayLiteral("Tree"))}) {
            QAbstractItemModel *const tempModel = baseModel.first(this);
            if (tempModel) {
                for (auto &&indexToInsert :
                     {std::make_pair(0, QByteArrayLiteral("Begin")), std::make_pair(tempModel->columnCount(), QByteArrayLiteral("End")),
                      std::make_pair(tempModel->columnCount() / 2, QByteArrayLiteral("Middle"))}) {
                    for (auto &&addViaProxy :
                         {std::make_pair(true, QByteArrayLiteral("via Proxy")), std::make_pair(false, QByteArrayLiteral("via Base"))}) {
                        QTest::newRow(
                                (baseModel.second + ' ' + insertDirection.second + ' ' + addViaProxy.second + ' ' + indexToInsert.second).constData())
                                << baseModel.first(this) << insertDirection.first << indexToInsert.first << addViaProxy.first;
                    }
                }
                tempModel->deleteLater();
            }
        }
    }
}